

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split_compilation.cpp
# Opt level: O0

void __thiscall
SplitCompilationTest_empty_list_long_Test<char16_t>::SplitCompilationTest_empty_list_long_Test
          (SplitCompilationTest_empty_list_long_Test<char16_t> *this)

{
  SplitCompilationTest_empty_list_long_Test<char16_t> *this_local;
  
  SplitCompilationTest<char16_t>::SplitCompilationTest(&this->super_SplitCompilationTest<char16_t>);
  *(undefined ***)&this->super_SplitCompilationTest<char16_t> =
       &PTR__SplitCompilationTest_empty_list_long_Test_00821e38;
  return;
}

Assistant:

TYPED_TEST(SplitCompilationTest, empty_list_long) {
	std::basic_string_view<TypeParam> empty;
	auto delim = make_delim_long<TypeParam>();
	EXPECT_TRUE(split<std::list>(empty, delim).empty());
	EXPECT_TRUE(split_n<std::list>(empty, delim, 5).empty());
	EXPECT_TRUE(split_view<std::list>(empty, delim).empty());
	EXPECT_TRUE(split_n_view<std::list>(empty, delim, 5).empty());
}